

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_spell(command *cmd,char *arg,player *p,int *spell,char *verb,item_tester book_filter
                     ,char *book_error,_func__Bool_player_ptr_wchar_t *spell_filter,
                     char *spell_error)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_48;
  object *book;
  item_tester book_filter_local;
  char *verb_local;
  int *spell_local;
  player *p_local;
  char *arg_local;
  command *cmd_local;
  
  book = (object *)book_filter;
  book_filter_local = (item_tester)verb;
  verb_local = (char *)spell;
  spell_local = (int *)p;
  p_local = (player *)arg;
  arg_local = (char *)cmd;
  wVar2 = cmd_get_arg_choice(cmd,arg,spell);
  if ((wVar2 == L'\0') &&
     ((spell_filter == (_func__Bool_player_ptr_wchar_t *)0x0 ||
      (_Var1 = (*spell_filter)((player *)spell_local,*(wchar_t *)verb_local), _Var1)))) {
    cmd_local._4_4_ = L'\0';
  }
  else {
    wVar2 = cmd_get_arg_item((command *)arg_local,"book",&local_48);
    if (wVar2 == L'\0') {
      wVar2 = get_spell_from_book((player *)spell_local,(char *)book_filter_local,local_48,
                                  spell_error,spell_filter);
      *(wchar_t *)verb_local = wVar2;
    }
    else {
      wVar2 = get_spell((player *)spell_local,(char *)book_filter_local,(item_tester)book,
                        *(cmd_code *)(arg_local + 4),book_error,spell_filter,spell_error,&local_48);
      *(wchar_t *)verb_local = wVar2;
    }
    if (*(int *)verb_local < 0) {
      cmd_local._4_4_ = L'\xfffffffd';
    }
    else {
      cmd_set_arg_item((command *)arg_local,"book",local_48);
      cmd_set_arg_choice((command *)arg_local,(char *)p_local,*(wchar_t *)verb_local);
      cmd_local._4_4_ = L'\0';
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int cmd_get_spell(struct command *cmd, const char *arg, struct player *p,
		int *spell,
		const char *verb, item_tester book_filter,
		const char *book_error,
		bool (*spell_filter)(const struct player *p, int spell),
		const char *spell_error)
{
	struct object *book;

	/* See if we've been provided with this one */
	if (cmd_get_arg_choice(cmd, arg, spell) == CMD_OK) {
		/* Ensure it passes the filter */
		if (!spell_filter || spell_filter(p, *spell) == true)
			return CMD_OK;
	}

	/* See if we've been given a book to look at */
	if (cmd_get_arg_item(cmd, "book", &book) == CMD_OK) {
		*spell = get_spell_from_book(p, verb, book, spell_error,
			spell_filter);
	} else {
		*spell = get_spell(p, verb, book_filter, cmd->code, book_error,
			spell_filter, spell_error, &book);
	}

	if (*spell >= 0) {
		cmd_set_arg_item(cmd, "book", book);
		cmd_set_arg_choice(cmd, arg, *spell);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}